

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

char cppurses::key_to_char(Code key)

{
  int16_t value;
  int16_t alpha_high;
  int16_t alpha_low;
  Code key_local;
  
  if (((short)key < 0x20) || (0x7e < (short)key)) {
    value._1_1_ = '\0';
  }
  else {
    value._1_1_ = (char)key;
  }
  return value._1_1_;
}

Assistant:

char key_to_char(Key::Code key) {
    const auto alpha_low = std::int16_t{32};
    const auto alpha_high = std::int16_t{126};
    const auto value = static_cast<std::int16_t>(key);
    if (value < alpha_low || value > alpha_high) {
        return '\0';
    }
    return static_cast<char>(value);
}